

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_rand.cc
# Opt level: O0

cpp_gen * new_normal_gen(void)

{
  result_type_conflict1 rVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  normal_distribution<double> *this_00;
  cpp_gen *pcVar2;
  cpp_gen *ng;
  normal_distribution<double> *d;
  mt19937 *gen;
  random_device rd;
  
  std::random_device::random_device((random_device *)&gen);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  rVar1 = std::random_device::operator()((random_device *)&gen);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,(ulong)rVar1);
  this_00 = (normal_distribution<double> *)operator_new(0x20);
  std::normal_distribution<double>::normal_distribution(this_00);
  pcVar2 = (cpp_gen *)operator_new(0x10);
  pcVar2->d = this_00;
  pcVar2->gen = this;
  std::random_device::~random_device((random_device *)&gen);
  return pcVar2;
}

Assistant:

struct cpp_gen *new_normal_gen() {
		std::random_device rd {};
		std::mt19937 *gen = new std::mt19937(rd());
		std::normal_distribution<double> *d = new std::normal_distribution<double>();
		struct cpp_gen *ng = new struct cpp_gen;
		ng->d = d;
		ng->gen = gen;

		return ng;
	}